

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O0

void FastPForLib::__unpack<5u>(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  byte bVar3;
  uint32_t *in_RSI;
  uint *in_RDI;
  uint32_t i;
  uint32_t k;
  uint32_t inwordpointer;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint32_t *local_10;
  uint *local_8;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    local_1c = 0;
    for (; (bVar3 = (byte)local_14, local_1c < 7 && (local_14 < 0x1c)); local_14 = local_14 + 5) {
      uVar2 = __bitmask<5u,true>(*local_8 >> (bVar3 & 0x1f));
      *local_10 = uVar2;
      local_1c = local_1c + 1;
      local_10 = local_10 + 1;
    }
    if (local_14 < 0x20) {
      uVar1 = *local_8;
      uVar2 = __bitmask<5u,true>(local_8[1] << (0x20 - bVar3 & 0x1f));
      *local_10 = uVar1 >> (bVar3 & 0x1f) | uVar2;
      local_14 = local_14 - 0x1b;
      local_10 = local_10 + 1;
    }
    else {
      local_14 = 0;
    }
    local_8 = local_8 + 1;
  }
  return;
}

Assistant:

void __unpack(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  uint32_t inwordpointer = 0; // indicates where we are writing
  // k iterates over the input
  for (uint32_t k = 0; k < bit; ++k, ++in) {
    // did not unroll; compiler did not detect invariant that inwordpointer is
    // always
    // small positive number
    /* for (; inwordpointer   /\*+   bit <= 32 *\/ <= 32-bit; inwordpointer +=
     * bit) { */
    /*       *out++ = __bitmask<bit> ((*in) >> inwordpointer); */
    /*   } */
    // grungy replacement to help with unrolling
    for (uint32_t i = 0; i < 1 + 32 / bit; ++i) {
      if (inwordpointer > 32 - bit)
        break;
      *out++ = __bitmask<bit, true>((*in) >> inwordpointer);
      inwordpointer += bit;
    }
    // end ofk grunge

    if (inwordpointer < 32) {
      *out++ = (in[0] >> inwordpointer) |
               __bitmask<bit, true>(in[1] << (32 - inwordpointer));
      inwordpointer += bit - 32;
    } else
      // inwordpointer==32
      inwordpointer = 0;
  }
}